

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  pointer pcVar3;
  key_type *__k;
  bool bVar4;
  LogMessage *other;
  iterator iVar5;
  Type *__k_00;
  mapped_type *pmVar6;
  long *plVar7;
  long *plVar8;
  Result *_result;
  long lVar9;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar10;
  _Rb_tree_header *p_Var11;
  string err;
  undefined1 local_100 [56];
  long local_c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_c0;
  Rep *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (bVar4) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    validateOutputCount(__return_storage_ptr__,layer,2,-1);
    bVar4 = Result::good(__return_storage_ptr__);
    if (bVar4) {
      pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      if (this->ndArrayInterpretation == true) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Split","");
        pmVar10 = &this->blobNameToRank;
        validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,pmVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar4 = Result::good(__return_storage_ptr__);
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        local_100._0_8_ = local_100 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"Split","");
        validateRankCount(__return_storage_ptr__,layer,(string *)local_100,3,-1,pmVar10);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
        }
        bVar4 = Result::good(__return_storage_ptr__);
        if (!bVar4) {
          return __return_storage_ptr__;
        }
        pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar1) {
          operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
        }
        local_c0 = pmVar10;
        if ((layer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_100,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          other = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_100,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_70,other);
          pmVar10 = local_c0;
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_100);
        }
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::find(&pmVar10->_M_t,
                       (key_type *)((layer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
        p_Var11 = &(this->blobNameToRank)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar5._M_node != p_Var11) {
          __k_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&(layer->output_).super_RepeatedPtrFieldBase,0);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ::at(pmVar10,__k_00);
          pmVar10 = local_c0;
          local_b8 = (layer->output_).super_RepeatedPtrFieldBase.rep_;
          if (local_b8 != (Rep *)0x0) {
            local_b8 = (Rep *)local_b8->elements;
          }
          local_c8 = (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_;
          if (local_c8 != 0) {
            iVar2 = *pmVar6;
            local_c8 = local_c8 << 3;
            lVar9 = 0;
            do {
              __k = *(key_type **)((long)local_b8->elements + lVar9 + -8);
              iVar5 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&pmVar10->_M_t,__k);
              if (((_Rb_tree_header *)iVar5._M_node != p_Var11) &&
                 (pmVar6 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           ::at(pmVar10,__k), iVar2 != *pmVar6)) {
                local_100._0_8_ = local_100 + 0x10;
                local_100._8_8_ = (char *)0x0;
                local_100[0x10] = '\0';
                plVar7 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
                lVar9 = *plVar7;
                local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b0,lVar9,plVar7[1] + lVar9);
                std::operator+(&local_90,"Layer \'",&local_b0);
                plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
                plVar8 = plVar7 + 2;
                if ((long *)*plVar7 == plVar8) {
                  local_60 = *plVar8;
                  lStack_58 = plVar7[3];
                  local_70 = &local_60;
                }
                else {
                  local_60 = *plVar8;
                  local_70 = (long *)*plVar7;
                }
                local_68 = plVar7[1];
                *plVar7 = (long)plVar8;
                plVar7[1] = 0;
                *(undefined1 *)(plVar7 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_100,(string *)&local_70);
                if (local_70 != &local_60) {
                  operator_delete(local_70,local_60 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_90._M_dataplus._M_p != &local_90.field_2) {
                  operator_delete(local_90._M_dataplus._M_p,
                                  local_90.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,
                                  local_b0.field_2._M_allocated_capacity + 1);
                }
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_100);
                if ((undefined1 *)local_100._0_8_ == local_100 + 0x10) {
                  return __return_storage_ptr__;
                }
                operator_delete((void *)local_100._0_8_,
                                CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
                return __return_storage_ptr__;
              }
              lVar9 = lVar9 + 8;
            } while (local_c8 != lVar9);
          }
        }
      }
      Result::Result(__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));

    // between 2 and any number of outputs
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, -1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Split", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Split", 3, -1, blobNameToRank));

        // check that all outputs have same rank
        int rank = 0;
        if (blobNameToRank.find(layer.output(0)) != blobNameToRank.end()) {
            rank = blobNameToRank.at(layer.output(0));
        } else {
            return Result();
        }

        for (const auto& output : layer.output()) {
            if (blobNameToRank.find(output) != blobNameToRank.end()) {
                if (rank != blobNameToRank.at(output)) {
                    std::string err;
                    err = "Layer '" + std::string(layer.name()) + "' of type 'Split' must have equal ranks for its outputs, but they are not equal.";
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                }
            }
        }
    }

    return Result();
}